

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot_base.hpp
# Opt level: O2

Locked_container_t * __thiscall
sig::Slot_base::lock(Locked_container_t *__return_storage_ptr__,Slot_base *this)

{
  pointer pwVar1;
  pointer pwVar2;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar1 = (this->tracked_ptrs_).
           super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pwVar2 = (this->tracked_ptrs_).
                super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_start; pwVar2 != pwVar1; pwVar2 = pwVar2 + 1) {
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_38,pwVar2);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    emplace_back<std::shared_ptr<void>>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
               __return_storage_ptr__,(shared_ptr<void> *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

Locked_container_t lock() const {
        Locked_container_t locked_vec;
        for (auto& tracked : tracked_ptrs_) {
            locked_vec.push_back(tracked.lock());
        }
        return locked_vec;
    }